

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::BVHNIntersector1<8,_16781328,_false,_embree::avx512::VirtualCurveIntersector1>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  float fVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [12];
  char cVar13;
  AABBNodeMB4D *node1;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  ulong uVar23;
  int iVar24;
  int iVar49;
  int iVar50;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar52;
  int iVar53;
  int iVar54;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  int iVar51;
  int iVar55;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  vfloat4 a0;
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar78 [32];
  Precalculations pre;
  NodeRef stack [564];
  float local_1218 [4];
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [16];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    if (0.0 <= ray->tfar) {
      aVar7 = (ray->dir).field_0.field_1;
      auVar61 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
      auVar12 = ZEXT812(0) << 0x20;
      auVar59 = ZEXT816(0) << 0x40;
      auVar60._4_12_ = auVar12;
      auVar60._0_4_ = auVar61._0_4_;
      auVar25 = vrsqrt14ss_avx512f(auVar59,auVar60);
      fVar58 = auVar25._0_4_;
      uVar1 = *(undefined4 *)&(ray->dir).field_0;
      local_1218[0] = fVar58 * 1.5 - auVar61._0_4_ * 0.5 * fVar58 * fVar58 * fVar58;
      uVar2 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      uVar3 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
      auVar63._0_4_ = aVar7.x * local_1218[0];
      auVar63._4_4_ = aVar7.y * local_1218[0];
      auVar63._8_4_ = aVar7.z * local_1218[0];
      auVar63._12_4_ = aVar7.field_3.w * local_1218[0];
      auVar25 = vshufpd_avx(auVar63,auVar63,1);
      auVar61 = vmovshdup_avx(auVar63);
      auVar57._8_4_ = 0x80000000;
      auVar57._0_8_ = 0x8000000080000000;
      auVar57._12_4_ = 0x80000000;
      auVar38._16_4_ = 0x80000000;
      auVar38._0_16_ = auVar57;
      auVar38._20_4_ = 0x80000000;
      auVar38._24_4_ = 0x80000000;
      auVar38._28_4_ = 0x80000000;
      auVar70._0_4_ = auVar61._0_4_ ^ 0x80000000;
      auVar61 = vunpckhps_avx(auVar63,auVar59);
      auVar70._4_12_ = auVar12;
      auVar28 = vshufps_avx(auVar61,auVar70,0x41);
      auVar66._0_8_ = auVar25._0_8_ ^ 0x8000000080000000;
      auVar66._8_8_ = auVar25._8_8_ ^ auVar57._8_8_;
      auVar27 = vinsertps_avx(auVar66,auVar63,0x2a);
      auVar61 = vdpps_avx(auVar28,auVar28,0x7f);
      auVar25 = vdpps_avx(auVar27,auVar27,0x7f);
      uVar9 = vcmpps_avx512vl(auVar25,auVar61,1);
      auVar61 = vpmovm2d_avx512vl(uVar9);
      auVar71._0_4_ = auVar61._0_4_;
      auVar71._4_4_ = auVar71._0_4_;
      auVar71._8_4_ = auVar71._0_4_;
      auVar71._12_4_ = auVar71._0_4_;
      uVar23 = vpmovd2m_avx512vl(auVar71);
      auVar61 = vpcmpeqd_avx(auVar71,auVar71);
      auVar26._4_4_ = (uint)((byte)(uVar23 >> 1) & 1) * auVar61._4_4_;
      auVar26._0_4_ = (uint)((byte)uVar23 & 1) * auVar61._0_4_;
      auVar26._8_4_ = (uint)((byte)(uVar23 >> 2) & 1) * auVar61._8_4_;
      auVar26._12_4_ = (uint)((byte)(uVar23 >> 3) & 1) * auVar61._12_4_;
      auVar61 = vblendvps_avx(auVar27,auVar28,auVar26);
      auVar25 = vdpps_avx(auVar61,auVar61,0x7f);
      auVar72._4_12_ = auVar12;
      auVar72._0_4_ = auVar25._0_4_;
      auVar27 = vrsqrt14ss_avx512f(auVar59,auVar72);
      fVar58 = auVar27._0_4_;
      fVar58 = fVar58 * 1.5 - auVar25._0_4_ * 0.5 * fVar58 * fVar58 * fVar58;
      auVar67._0_4_ = auVar61._0_4_ * fVar58;
      auVar67._4_4_ = auVar61._4_4_ * fVar58;
      auVar67._8_4_ = auVar61._8_4_ * fVar58;
      auVar67._12_4_ = auVar61._12_4_ * fVar58;
      auVar61 = vshufps_avx(auVar67,auVar67,0xc9);
      auVar25 = vshufps_avx(auVar63,auVar63,0xc9);
      auVar73._0_4_ = auVar67._0_4_ * auVar25._0_4_;
      auVar73._4_4_ = auVar67._4_4_ * auVar25._4_4_;
      auVar73._8_4_ = auVar67._8_4_ * auVar25._8_4_;
      auVar73._12_4_ = auVar67._12_4_ * auVar25._12_4_;
      auVar61 = vfmsub231ps_fma(auVar73,auVar63,auVar61);
      auVar25 = vshufps_avx(auVar61,auVar61,0xc9);
      auVar61 = vdpps_avx(auVar25,auVar25,0x7f);
      auVar74._4_12_ = auVar12;
      auVar74._0_4_ = auVar61._0_4_;
      auVar27 = vrsqrt14ss_avx512f(auVar59,auVar74);
      fVar58 = auVar27._0_4_;
      fVar58 = fVar58 * 1.5 - auVar61._0_4_ * 0.5 * fVar58 * fVar58 * fVar58;
      auVar62._0_4_ = auVar25._0_4_ * fVar58;
      auVar62._4_4_ = auVar25._4_4_ * fVar58;
      auVar62._8_4_ = auVar25._8_4_ * fVar58;
      auVar62._12_4_ = auVar25._12_4_ * fVar58;
      auVar61._0_4_ = local_1218[0] * auVar63._0_4_;
      auVar61._4_4_ = local_1218[0] * auVar63._4_4_;
      auVar61._8_4_ = local_1218[0] * auVar63._8_4_;
      auVar61._12_4_ = local_1218[0] * auVar63._12_4_;
      auVar27 = vunpcklps_avx(auVar67,auVar61);
      auVar61 = vunpckhps_avx(auVar67,auVar61);
      auVar28 = vunpcklps_avx(auVar62,auVar59);
      auVar25 = vunpckhps_avx(auVar62,auVar59);
      local_11e8 = vunpcklps_avx(auVar61,auVar25);
      local_1208 = vunpcklps_avx(auVar27,auVar28);
      local_11f8 = vunpckhps_avx(auVar27,auVar28);
      auVar61 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar25._8_4_ = 0x7fffffff;
      auVar25._0_8_ = 0x7fffffff7fffffff;
      auVar25._12_4_ = 0x7fffffff;
      auVar25 = vandps_avx512vl((undefined1  [16])aVar7,auVar25);
      auVar59._8_4_ = 0x219392ef;
      auVar59._0_8_ = 0x219392ef219392ef;
      auVar59._12_4_ = 0x219392ef;
      puVar19 = local_11d0;
      uVar23 = vcmpps_avx512vl(auVar25,auVar59,1);
      bVar22 = (bool)((byte)uVar23 & 1);
      auVar28._0_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * (int)aVar7.x;
      bVar22 = (bool)((byte)(uVar23 >> 1) & 1);
      auVar28._4_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * (int)aVar7.y;
      bVar22 = (bool)((byte)(uVar23 >> 2) & 1);
      auVar28._8_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * (int)aVar7.z;
      bVar22 = (bool)((byte)(uVar23 >> 3) & 1);
      auVar28._12_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * aVar7.field_3.a;
      auVar25 = vrcp14ps_avx512vl(auVar28);
      auVar27._8_4_ = 0x3f800000;
      auVar27._0_8_ = 0x3f8000003f800000;
      auVar27._12_4_ = 0x3f800000;
      auVar27 = vfnmadd213ps_avx512vl(auVar28,auVar25,auVar27);
      auVar28 = vfmadd132ps_fma(auVar27,auVar25,auVar25);
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      uVar5 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      uVar6 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar29 = vbroadcastss_avx512vl(auVar28);
      auVar25 = vmovshdup_avx(auVar28);
      auVar30 = vbroadcastsd_avx512vl(auVar25);
      auVar27 = vshufpd_avx(auVar28,auVar28,1);
      auVar32._8_4_ = 2;
      auVar32._0_8_ = 0x200000002;
      auVar32._12_4_ = 2;
      auVar32._16_4_ = 2;
      auVar32._20_4_ = 2;
      auVar32._24_4_ = 2;
      auVar32._28_4_ = 2;
      auVar31 = vpermps_avx512vl(auVar32,ZEXT1632(auVar28));
      fVar58 = auVar28._0_4_ * (ray->org).field_0.m128[0];
      auVar34._4_4_ = fVar58;
      auVar34._0_4_ = fVar58;
      auVar34._8_4_ = fVar58;
      auVar34._12_4_ = fVar58;
      auVar34._16_4_ = fVar58;
      auVar34._20_4_ = fVar58;
      auVar34._24_4_ = fVar58;
      auVar34._28_4_ = fVar58;
      auVar35._8_4_ = 1;
      auVar35._0_8_ = 0x100000001;
      auVar35._12_4_ = 1;
      auVar35._16_4_ = 1;
      auVar35._20_4_ = 1;
      auVar35._24_4_ = 1;
      auVar35._28_4_ = 1;
      auVar36 = ZEXT1632(CONCAT412(auVar28._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar28._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar28._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar58))));
      auVar35 = vpermps_avx2(auVar35,auVar36);
      auVar68 = ZEXT3264(auVar35);
      auVar36 = vpermps_avx2(auVar32,auVar36);
      uVar21 = (ulong)(auVar28._0_4_ < 0.0) * 0x20;
      uVar20 = (ulong)(auVar25._0_4_ < 0.0) << 5 | 0x40;
      uVar23 = (ulong)(auVar27._0_4_ < 0.0) << 5 | 0x80;
      auVar32 = vbroadcastss_avx512vl(auVar61);
      auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)ray->tfar));
      auVar34 = vxorps_avx512vl(auVar34,auVar38);
      auVar35 = vxorps_avx512vl(auVar35,auVar38);
      auVar36 = vxorps_avx512vl(auVar36,auVar38);
LAB_0068e888:
      do {
        if (puVar19 == &local_11d8) {
          return;
        }
        uVar15 = puVar19[-1];
        puVar19 = puVar19 + -1;
        while ((uVar15 & 8) == 0) {
          fVar58 = (ray->dir).field_0.m128[3];
          uVar17 = (uint)uVar15 & 7;
          uVar14 = uVar15 & 0xfffffffffffffff0;
          if (uVar17 == 3) {
            auVar75._4_4_ = fVar58;
            auVar75._0_4_ = fVar58;
            auVar75._8_4_ = fVar58;
            auVar75._12_4_ = fVar58;
            auVar75._16_4_ = fVar58;
            auVar75._20_4_ = fVar58;
            auVar75._24_4_ = fVar58;
            auVar75._28_4_ = fVar58;
            fVar8 = 1.0 - fVar58;
            auVar78._4_4_ = fVar8;
            auVar78._0_4_ = fVar8;
            auVar78._8_4_ = fVar8;
            auVar78._12_4_ = fVar8;
            auVar78._16_4_ = fVar8;
            auVar78._20_4_ = fVar8;
            auVar78._24_4_ = fVar8;
            auVar78._28_4_ = fVar8;
            auVar64._0_4_ = fVar58 * *(float *)(uVar14 + 0x1c0);
            auVar64._4_4_ = fVar58 * *(float *)(uVar14 + 0x1c4);
            auVar64._8_4_ = fVar58 * *(float *)(uVar14 + 0x1c8);
            auVar64._12_4_ = fVar58 * *(float *)(uVar14 + 0x1cc);
            auVar64._16_4_ = fVar58 * *(float *)(uVar14 + 0x1d0);
            auVar64._20_4_ = fVar58 * *(float *)(uVar14 + 0x1d4);
            auVar64._24_4_ = fVar58 * *(float *)(uVar14 + 0x1d8);
            auVar64._28_4_ = 0;
            auVar65._0_4_ = fVar58 * *(float *)(uVar14 + 0x1e0);
            auVar65._4_4_ = fVar58 * *(float *)(uVar14 + 0x1e4);
            auVar65._8_4_ = fVar58 * *(float *)(uVar14 + 0x1e8);
            auVar65._12_4_ = fVar58 * *(float *)(uVar14 + 0x1ec);
            auVar65._16_4_ = fVar58 * *(float *)(uVar14 + 0x1f0);
            auVar65._20_4_ = fVar58 * *(float *)(uVar14 + 500);
            auVar65._24_4_ = fVar58 * *(float *)(uVar14 + 0x1f8);
            auVar65._28_4_ = 0;
            auVar69._0_4_ = fVar58 * *(float *)(uVar14 + 0x200);
            auVar69._4_4_ = fVar58 * *(float *)(uVar14 + 0x204);
            auVar69._8_4_ = fVar58 * *(float *)(uVar14 + 0x208);
            auVar69._12_4_ = fVar58 * *(float *)(uVar14 + 0x20c);
            auVar69._16_4_ = fVar58 * *(float *)(uVar14 + 0x210);
            auVar69._20_4_ = fVar58 * *(float *)(uVar14 + 0x214);
            auVar69._28_36_ = auVar68._28_36_;
            auVar69._24_4_ = fVar58 * *(float *)(uVar14 + 0x218);
            auVar27 = ZEXT816(0) << 0x40;
            auVar61 = vfmadd231ps_fma(auVar64,auVar78,ZEXT1632(auVar27));
            auVar25 = vfmadd231ps_fma(auVar65,auVar78,ZEXT1632(auVar27));
            auVar27 = vfmadd231ps_fma(auVar69._0_32_,auVar78,ZEXT1632(auVar27));
            auVar68 = ZEXT1664(auVar27);
            auVar38 = vmulps_avx512vl(auVar75,*(undefined1 (*) [32])(uVar14 + 0x260));
            auVar76._0_4_ = fVar8 + fVar58 * *(float *)(uVar14 + 0x220);
            auVar76._4_4_ = fVar8 + fVar58 * *(float *)(uVar14 + 0x224);
            auVar76._8_4_ = fVar8 + fVar58 * *(float *)(uVar14 + 0x228);
            auVar76._12_4_ = fVar8 + fVar58 * *(float *)(uVar14 + 0x22c);
            auVar76._16_4_ = fVar8 + fVar58 * *(float *)(uVar14 + 0x230);
            auVar76._20_4_ = fVar8 + fVar58 * *(float *)(uVar14 + 0x234);
            auVar76._24_4_ = fVar8 + fVar58 * *(float *)(uVar14 + 0x238);
            auVar76._28_4_ = fVar8 + in_ZMM13._28_4_;
            auVar77._0_4_ = fVar8 + fVar58 * *(float *)(uVar14 + 0x240);
            auVar77._4_4_ = fVar8 + fVar58 * *(float *)(uVar14 + 0x244);
            auVar77._8_4_ = fVar8 + fVar58 * *(float *)(uVar14 + 0x248);
            auVar77._12_4_ = fVar8 + fVar58 * *(float *)(uVar14 + 0x24c);
            auVar77._16_4_ = fVar8 + fVar58 * *(float *)(uVar14 + 0x250);
            auVar77._20_4_ = fVar8 + fVar58 * *(float *)(uVar14 + 0x254);
            auVar77._24_4_ = fVar8 + fVar58 * *(float *)(uVar14 + 600);
            auVar77._28_4_ = fVar8 + 0.0;
            in_ZMM13 = ZEXT3264(auVar77);
            auVar42 = vaddps_avx512vl(auVar78,auVar38);
            auVar44._4_4_ = uVar3;
            auVar44._0_4_ = uVar3;
            auVar44._8_4_ = uVar3;
            auVar44._12_4_ = uVar3;
            auVar44._16_4_ = uVar3;
            auVar44._20_4_ = uVar3;
            auVar44._24_4_ = uVar3;
            auVar44._28_4_ = uVar3;
            auVar38 = vmulps_avx512vl(auVar44,*(undefined1 (*) [32])(uVar14 + 0x100));
            auVar39 = vmulps_avx512vl(auVar44,*(undefined1 (*) [32])(uVar14 + 0x120));
            auVar37 = vmulps_avx512vl(auVar44,*(undefined1 (*) [32])(uVar14 + 0x140));
            auVar45._4_4_ = uVar2;
            auVar45._0_4_ = uVar2;
            auVar45._8_4_ = uVar2;
            auVar45._12_4_ = uVar2;
            auVar45._16_4_ = uVar2;
            auVar45._20_4_ = uVar2;
            auVar45._24_4_ = uVar2;
            auVar45._28_4_ = uVar2;
            auVar38 = vfmadd231ps_avx512vl(auVar38,auVar45,*(undefined1 (*) [32])(uVar14 + 0xa0));
            auVar39 = vfmadd231ps_avx512vl(auVar39,auVar45,*(undefined1 (*) [32])(uVar14 + 0xc0));
            auVar37 = vfmadd231ps_avx512vl(auVar37,auVar45,*(undefined1 (*) [32])(uVar14 + 0xe0));
            auVar46._4_4_ = uVar1;
            auVar46._0_4_ = uVar1;
            auVar46._8_4_ = uVar1;
            auVar46._12_4_ = uVar1;
            auVar46._16_4_ = uVar1;
            auVar46._20_4_ = uVar1;
            auVar46._24_4_ = uVar1;
            auVar46._28_4_ = uVar1;
            auVar38 = vfmadd231ps_avx512vl(auVar38,auVar46,*(undefined1 (*) [32])(uVar14 + 0x40));
            auVar39 = vfmadd231ps_avx512vl(auVar39,auVar46,*(undefined1 (*) [32])(uVar14 + 0x60));
            auVar37 = vfmadd231ps_avx512vl(auVar37,auVar46,*(undefined1 (*) [32])(uVar14 + 0x80));
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar38,auVar40);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
            uVar15 = vcmpps_avx512vl(auVar40,auVar41,1);
            bVar22 = (bool)((byte)uVar15 & 1);
            iVar24 = auVar41._0_4_;
            auVar47._0_4_ = (uint)bVar22 * iVar24 | (uint)!bVar22 * auVar38._0_4_;
            bVar22 = (bool)((byte)(uVar15 >> 1) & 1);
            iVar49 = auVar41._4_4_;
            auVar47._4_4_ = (uint)bVar22 * iVar49 | (uint)!bVar22 * auVar38._4_4_;
            bVar22 = (bool)((byte)(uVar15 >> 2) & 1);
            iVar50 = auVar41._8_4_;
            auVar47._8_4_ = (uint)bVar22 * iVar50 | (uint)!bVar22 * auVar38._8_4_;
            bVar22 = (bool)((byte)(uVar15 >> 3) & 1);
            iVar51 = auVar41._12_4_;
            auVar47._12_4_ = (uint)bVar22 * iVar51 | (uint)!bVar22 * auVar38._12_4_;
            bVar22 = (bool)((byte)(uVar15 >> 4) & 1);
            iVar52 = auVar41._16_4_;
            auVar47._16_4_ = (uint)bVar22 * iVar52 | (uint)!bVar22 * auVar38._16_4_;
            bVar22 = (bool)((byte)(uVar15 >> 5) & 1);
            iVar53 = auVar41._20_4_;
            auVar47._20_4_ = (uint)bVar22 * iVar53 | (uint)!bVar22 * auVar38._20_4_;
            bVar22 = (bool)((byte)(uVar15 >> 6) & 1);
            iVar54 = auVar41._24_4_;
            iVar55 = auVar41._28_4_;
            auVar47._24_4_ = (uint)bVar22 * iVar54 | (uint)!bVar22 * auVar38._24_4_;
            bVar22 = SUB81(uVar15 >> 7,0);
            auVar47._28_4_ = (uint)bVar22 * iVar55 | (uint)!bVar22 * auVar38._28_4_;
            vandps_avx512vl(auVar39,auVar40);
            uVar15 = vcmpps_avx512vl(auVar47,auVar41,1);
            bVar22 = (bool)((byte)uVar15 & 1);
            auVar48._0_4_ = (uint)bVar22 * iVar24 | (uint)!bVar22 * auVar39._0_4_;
            bVar22 = (bool)((byte)(uVar15 >> 1) & 1);
            auVar48._4_4_ = (uint)bVar22 * iVar49 | (uint)!bVar22 * auVar39._4_4_;
            bVar22 = (bool)((byte)(uVar15 >> 2) & 1);
            auVar48._8_4_ = (uint)bVar22 * iVar50 | (uint)!bVar22 * auVar39._8_4_;
            bVar22 = (bool)((byte)(uVar15 >> 3) & 1);
            auVar48._12_4_ = (uint)bVar22 * iVar51 | (uint)!bVar22 * auVar39._12_4_;
            bVar22 = (bool)((byte)(uVar15 >> 4) & 1);
            auVar48._16_4_ = (uint)bVar22 * iVar52 | (uint)!bVar22 * auVar39._16_4_;
            bVar22 = (bool)((byte)(uVar15 >> 5) & 1);
            auVar48._20_4_ = (uint)bVar22 * iVar53 | (uint)!bVar22 * auVar39._20_4_;
            bVar22 = (bool)((byte)(uVar15 >> 6) & 1);
            auVar48._24_4_ = (uint)bVar22 * iVar54 | (uint)!bVar22 * auVar39._24_4_;
            bVar22 = SUB81(uVar15 >> 7,0);
            auVar48._28_4_ = (uint)bVar22 * iVar55 | (uint)!bVar22 * auVar39._28_4_;
            vandps_avx512vl(auVar37,auVar40);
            uVar15 = vcmpps_avx512vl(auVar48,auVar41,1);
            bVar22 = (bool)((byte)uVar15 & 1);
            auVar43._0_4_ = (uint)bVar22 * iVar24 | (uint)!bVar22 * auVar37._0_4_;
            bVar22 = (bool)((byte)(uVar15 >> 1) & 1);
            auVar43._4_4_ = (uint)bVar22 * iVar49 | (uint)!bVar22 * auVar37._4_4_;
            bVar22 = (bool)((byte)(uVar15 >> 2) & 1);
            auVar43._8_4_ = (uint)bVar22 * iVar50 | (uint)!bVar22 * auVar37._8_4_;
            bVar22 = (bool)((byte)(uVar15 >> 3) & 1);
            auVar43._12_4_ = (uint)bVar22 * iVar51 | (uint)!bVar22 * auVar37._12_4_;
            bVar22 = (bool)((byte)(uVar15 >> 4) & 1);
            auVar43._16_4_ = (uint)bVar22 * iVar52 | (uint)!bVar22 * auVar37._16_4_;
            bVar22 = (bool)((byte)(uVar15 >> 5) & 1);
            auVar43._20_4_ = (uint)bVar22 * iVar53 | (uint)!bVar22 * auVar37._20_4_;
            bVar22 = (bool)((byte)(uVar15 >> 6) & 1);
            auVar43._24_4_ = (uint)bVar22 * iVar54 | (uint)!bVar22 * auVar37._24_4_;
            bVar22 = SUB81(uVar15 >> 7,0);
            auVar43._28_4_ = (uint)bVar22 * iVar55 | (uint)!bVar22 * auVar37._28_4_;
            auVar38 = vrcp14ps_avx512vl(auVar47);
            auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar37 = vfnmadd213ps_avx512vl(auVar47,auVar38,auVar39);
            auVar44 = vfmadd132ps_avx512vl(auVar37,auVar38,auVar38);
            auVar38 = vrcp14ps_avx512vl(auVar48);
            auVar37 = vfnmadd213ps_avx512vl(auVar48,auVar38,auVar39);
            auVar45 = vfmadd132ps_avx512vl(auVar37,auVar38,auVar38);
            auVar38 = vrcp14ps_avx512vl(auVar43);
            auVar37 = vfnmadd213ps_avx512vl(auVar43,auVar38,auVar39);
            auVar39._4_4_ = uVar6;
            auVar39._0_4_ = uVar6;
            auVar39._8_4_ = uVar6;
            auVar39._12_4_ = uVar6;
            auVar39._16_4_ = uVar6;
            auVar39._20_4_ = uVar6;
            auVar39._24_4_ = uVar6;
            auVar39._28_4_ = uVar6;
            auVar40 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar14 + 0x100),auVar39,
                                 *(undefined1 (*) [32])(uVar14 + 0x160));
            auVar46 = vfmadd132ps_avx512vl(auVar37,auVar38,auVar38);
            auVar38 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar14 + 0x120),auVar39,
                                 *(undefined1 (*) [32])(uVar14 + 0x180));
            auVar39 = vfmadd213ps_avx512vl
                                (*(undefined1 (*) [32])(uVar14 + 0x140),auVar39,
                                 *(undefined1 (*) [32])(uVar14 + 0x1a0));
            auVar37._4_4_ = uVar5;
            auVar37._0_4_ = uVar5;
            auVar37._8_4_ = uVar5;
            auVar37._12_4_ = uVar5;
            auVar37._16_4_ = uVar5;
            auVar37._20_4_ = uVar5;
            auVar37._24_4_ = uVar5;
            auVar37._28_4_ = uVar5;
            auVar40 = vfmadd231ps_avx512vl(auVar40,auVar37,*(undefined1 (*) [32])(uVar14 + 0xa0));
            auVar38 = vfmadd231ps_avx512vl(auVar38,auVar37,*(undefined1 (*) [32])(uVar14 + 0xc0));
            auVar39 = vfmadd231ps_avx512vl(auVar39,auVar37,*(undefined1 (*) [32])(uVar14 + 0xe0));
            auVar41._4_4_ = uVar4;
            auVar41._0_4_ = uVar4;
            auVar41._8_4_ = uVar4;
            auVar41._12_4_ = uVar4;
            auVar41._16_4_ = uVar4;
            auVar41._20_4_ = uVar4;
            auVar41._24_4_ = uVar4;
            auVar41._28_4_ = uVar4;
            auVar28 = vfmadd231ps_fma(auVar40,auVar41,*(undefined1 (*) [32])(uVar14 + 0x40));
            auVar26 = vfmadd231ps_fma(auVar38,auVar41,*(undefined1 (*) [32])(uVar14 + 0x60));
            auVar57 = vfmadd231ps_fma(auVar39,auVar41,*(undefined1 (*) [32])(uVar14 + 0x80));
            auVar38 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar28));
            auVar39 = vsubps_avx(ZEXT1632(auVar25),ZEXT1632(auVar26));
            auVar37 = vsubps_avx(ZEXT1632(auVar27),ZEXT1632(auVar57));
            auVar40._4_4_ = auVar44._4_4_ * auVar38._4_4_;
            auVar40._0_4_ = auVar44._0_4_ * auVar38._0_4_;
            auVar40._8_4_ = auVar44._8_4_ * auVar38._8_4_;
            auVar40._12_4_ = auVar44._12_4_ * auVar38._12_4_;
            auVar40._16_4_ = auVar44._16_4_ * auVar38._16_4_;
            auVar40._20_4_ = auVar44._20_4_ * auVar38._20_4_;
            auVar40._24_4_ = auVar44._24_4_ * auVar38._24_4_;
            auVar40._28_4_ = auVar38._28_4_;
            auVar47 = vmulps_avx512vl(auVar39,auVar45);
            auVar48 = vmulps_avx512vl(auVar37,auVar46);
            auVar38 = vsubps_avx(auVar76,ZEXT1632(auVar28));
            auVar39 = vsubps_avx(auVar77,ZEXT1632(auVar26));
            auVar37 = vsubps_avx(auVar42,ZEXT1632(auVar57));
            auVar42._4_4_ = auVar44._4_4_ * auVar38._4_4_;
            auVar42._0_4_ = auVar44._0_4_ * auVar38._0_4_;
            auVar42._8_4_ = auVar44._8_4_ * auVar38._8_4_;
            auVar42._12_4_ = auVar44._12_4_ * auVar38._12_4_;
            auVar42._16_4_ = auVar44._16_4_ * auVar38._16_4_;
            auVar42._20_4_ = auVar44._20_4_ * auVar38._20_4_;
            auVar42._24_4_ = auVar44._24_4_ * auVar38._24_4_;
            auVar42._28_4_ = auVar38._28_4_;
            auVar44 = vmulps_avx512vl(auVar39,auVar45);
            auVar45 = vmulps_avx512vl(auVar37,auVar46);
            auVar41 = vpminsd_avx2(auVar40,auVar42);
            auVar38 = vpminsd_avx2(auVar47,auVar44);
            auVar39 = vpminsd_avx2(auVar48,auVar45);
            auVar38 = vmaxps_avx(auVar38,auVar39);
            auVar37 = vpmaxsd_avx2(auVar40,auVar42);
            auVar39 = vpmaxsd_avx2(auVar47,auVar44);
            auVar40 = vpmaxsd_avx2(auVar48,auVar45);
            auVar39 = vminps_avx(auVar39,auVar40);
            auVar40 = vmaxps_avx512vl(auVar32,auVar41);
            auVar38 = vmaxps_avx(auVar40,auVar38);
            auVar37 = vminps_avx512vl(auVar33,auVar37);
            auVar39 = vminps_avx(auVar37,auVar39);
            uVar9 = vcmpps_avx512vl(auVar38,auVar39,2);
            uVar17 = (uint)uVar9;
          }
          else {
            auVar56._4_4_ = fVar58;
            auVar56._0_4_ = fVar58;
            auVar56._8_4_ = fVar58;
            auVar56._12_4_ = fVar58;
            auVar56._16_4_ = fVar58;
            auVar56._20_4_ = fVar58;
            auVar56._24_4_ = fVar58;
            auVar56._28_4_ = fVar58;
            auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar14 + 0x100 + uVar21),auVar56,
                                      *(undefined1 (*) [32])(uVar14 + 0x40 + uVar21));
            auVar37 = vfmadd213ps_avx512vl(ZEXT1632(auVar61),auVar29,auVar34);
            auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar14 + 0x100 + uVar20),auVar56,
                                      *(undefined1 (*) [32])(uVar14 + 0x40 + uVar20));
            auVar25 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar14 + 0x100 + uVar23),auVar56,
                                      *(undefined1 (*) [32])(uVar14 + 0x40 + uVar23));
            auVar38 = vfmadd213ps_avx512vl(ZEXT1632(auVar61),auVar30,auVar35);
            auVar39 = vfmadd213ps_avx512vl(ZEXT1632(auVar25),auVar31,auVar36);
            auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar14 + 0x100 + (uVar21 ^ 0x20)),
                                      auVar56,*(undefined1 (*) [32])
                                               (uVar14 + 0x40 + (uVar21 ^ 0x20)));
            auVar38 = vmaxps_avx(auVar38,auVar39);
            auVar40 = vfmadd213ps_avx512vl(ZEXT1632(auVar61),auVar29,auVar34);
            auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar14 + 0x100 + (uVar20 ^ 0x20)),
                                      auVar56,*(undefined1 (*) [32])
                                               (uVar14 + 0x40 + (uVar20 ^ 0x20)));
            auVar39 = vfmadd213ps_avx512vl(ZEXT1632(auVar61),auVar30,auVar35);
            auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar14 + 0x100 + (uVar23 ^ 0x20)),
                                      auVar56,*(undefined1 (*) [32])
                                               (uVar14 + 0x40 + (uVar23 ^ 0x20)));
            auVar41 = vfmadd213ps_avx512vl(ZEXT1632(auVar61),auVar31,auVar36);
            auVar39 = vminps_avx(auVar39,auVar41);
            auVar37 = vmaxps_avx512vl(auVar32,auVar37);
            auVar38 = vmaxps_avx(auVar37,auVar38);
            auVar37 = vminps_avx512vl(auVar33,auVar40);
            auVar39 = vminps_avx(auVar37,auVar39);
            if (uVar17 == 6) {
              uVar9 = vcmpps_avx512vl(auVar38,auVar39,2);
              uVar10 = vcmpps_avx512vl(auVar56,*(undefined1 (*) [32])(uVar14 + 0x1c0),0xd);
              uVar11 = vcmpps_avx512vl(auVar56,*(undefined1 (*) [32])(uVar14 + 0x1e0),1);
              uVar17 = (uint)uVar9 & (uint)uVar10 & (uint)uVar11;
            }
            else {
              uVar9 = vcmpps_avx512vl(auVar38,auVar39,2);
              uVar17 = (uint)uVar9;
            }
          }
          if ((byte)uVar17 == 0) goto LAB_0068e888;
          lVar16 = 0;
          for (uVar15 = (ulong)(byte)uVar17; (uVar15 & 1) == 0;
              uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            lVar16 = lVar16 + 1;
          }
          uVar15 = *(ulong *)(uVar14 + lVar16 * 8);
          uVar17 = (uVar17 & 0xff) - 1 & uVar17 & 0xff;
          uVar18 = (ulong)uVar17;
          if (uVar17 != 0) {
            *puVar19 = uVar15;
            lVar16 = 0;
            for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
              lVar16 = lVar16 + 1;
            }
            uVar17 = uVar17 - 1 & uVar17;
            uVar18 = (ulong)uVar17;
            bVar22 = uVar17 == 0;
            while( true ) {
              puVar19 = puVar19 + 1;
              uVar15 = *(ulong *)(uVar14 + lVar16 * 8);
              if (bVar22) break;
              *puVar19 = uVar15;
              lVar16 = 0;
              for (uVar15 = uVar18; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                lVar16 = lVar16 + 1;
              }
              uVar18 = uVar18 - 1 & uVar18;
              bVar22 = uVar18 == 0;
            }
          }
        }
        auVar68 = ZEXT1664(auVar68._0_16_);
        in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
        cVar13 = (**(code **)((long)This->leafIntersector +
                             (ulong)*(byte *)(uVar15 & 0xfffffffffffffff0) * 0x40 + 8))
                           (local_1218,ray,context);
      } while (cVar13 == '\0');
      ray->tfar = -INFINITY;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }